

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_read_plain(curl_socket_t sockfd,char *buf,size_t bytesfromsocket,ssize_t *n)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int err;
  ssize_t nread;
  ssize_t *n_local;
  size_t bytesfromsocket_local;
  char *buf_local;
  curl_socket_t sockfd_local;
  
  sVar2 = recv(sockfd,buf,bytesfromsocket,0);
  if (sVar2 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if (((iVar1 == 0xb) || (iVar1 == 0xb)) || (iVar1 == 4)) {
      buf_local._4_4_ = CURLE_AGAIN;
    }
    else {
      buf_local._4_4_ = CURLE_RECV_ERROR;
    }
  }
  else {
    *n = sVar2;
    buf_local._4_4_ = CURLE_OK;
  }
  return buf_local._4_4_;
}

Assistant:

CURLcode Curl_read_plain(curl_socket_t sockfd,
                         char *buf,
                         size_t bytesfromsocket,
                         ssize_t *n)
{
  ssize_t nread = sread(sockfd, buf, bytesfromsocket);

  if(-1 == nread) {
    int err = SOCKERRNO;
#ifdef USE_WINSOCK
    if(WSAEWOULDBLOCK == err)
#else
    if((EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err))
#endif
      return CURLE_AGAIN;
    else
      return CURLE_RECV_ERROR;
  }

  /* we only return number of bytes read when we return OK */
  *n = nread;
  return CURLE_OK;
}